

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

ScriptFunctionType * __thiscall
Js::FunctionProxy::GetCrossSiteUndeferredFunctionType(FunctionProxy *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FunctionInfo *pFVar4;
  ParseableFunctionInfo *pPVar5;
  
  pFVar4 = (this->functionInfo).ptr;
  if (pFVar4 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x537,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) goto LAB_0075f9ac;
    *puVar3 = 0;
    pFVar4 = (this->functionInfo).ptr;
  }
  if ((pFVar4->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x538,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar2) {
LAB_0075f9ac:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pFVar4 = (this->functionInfo).ptr;
    if ((pFVar4->functionBodyImpl).ptr == (FunctionProxy *)0x0) {
      return (ScriptFunctionType *)0x0;
    }
  }
  if ((pFVar4->attributes & DeferredDeserialize) != None) {
    return (ScriptFunctionType *)0x0;
  }
  pPVar5 = GetParseableFunctionInfo(this);
  return (pPVar5->crossSiteUndeferredFunctionType).ptr;
}

Assistant:

ScriptFunctionType * FunctionProxy::GetCrossSiteUndeferredFunctionType() const
    {
        return HasParseableInfo() ? GetParseableFunctionInfo()->GetCrossSiteUndeferredFunctionType() : nullptr;
    }